

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

bool embree::avx::SphereMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  ulong uVar9;
  undefined1 auVar10 [32];
  uint uVar11;
  byte bVar12;
  undefined1 (*pauVar13) [16];
  bool bVar14;
  Scene *pSVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar32;
  float fVar33;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar34;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined1 local_238 [16];
  undefined1 (*local_220) [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  RTCFilterFunctionNArguments local_1f8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined1 auVar42 [64];
  undefined1 auVar54 [64];
  
  pSVar15 = context->scene;
  pGVar5 = (pSVar15->geometries).items[sphere->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar25 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar20 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar43 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar23 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar35 = vunpcklps_avx(auVar25,auVar43);
  auVar25 = vunpckhps_avx(auVar25,auVar43);
  auVar43 = vunpcklps_avx(auVar20,auVar23);
  auVar20 = vunpckhps_avx(auVar20,auVar23);
  auVar23 = vunpcklps_avx(auVar35,auVar43);
  auVar43 = vunpckhps_avx(auVar35,auVar43);
  auVar17 = vunpcklps_avx(auVar25,auVar20);
  auVar27 = vunpckhps_avx(auVar25,auVar20);
  auVar25 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar20 = vpcmpgtd_avx(auVar25,_DAT_01f7fcf0);
  local_d8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar23 = vsubps_avx(auVar23,auVar39);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35 = vsubps_avx(auVar43,auVar35);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar17 = vsubps_avx(auVar17,auVar25);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar50 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar51 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar52 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
  auVar25 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar43 = vshufps_avx(auVar25,auVar25,0);
  auVar25 = vrcpps_avx(auVar43);
  fVar24 = auVar25._0_4_;
  auVar26._0_4_ = fVar24 * auVar43._0_4_;
  fVar32 = auVar25._4_4_;
  auVar26._4_4_ = fVar32 * auVar43._4_4_;
  fVar33 = auVar25._8_4_;
  auVar26._8_4_ = fVar33 * auVar43._8_4_;
  fVar34 = auVar25._12_4_;
  auVar26._12_4_ = fVar34 * auVar43._12_4_;
  auVar43._8_4_ = 0x3f800000;
  auVar43._0_8_ = 0x3f8000003f800000;
  auVar43._12_4_ = 0x3f800000;
  auVar25 = vsubps_avx(auVar43,auVar26);
  fVar24 = fVar24 + fVar24 * auVar25._0_4_;
  fVar32 = fVar32 + fVar32 * auVar25._4_4_;
  fVar33 = fVar33 + fVar33 * auVar25._8_4_;
  fVar34 = fVar34 + fVar34 * auVar25._12_4_;
  auVar36._0_4_ = (fVar2 * auVar23._0_4_ + fVar3 * auVar35._0_4_ + fVar4 * auVar17._0_4_) * fVar24;
  auVar36._4_4_ = (fVar2 * auVar23._4_4_ + fVar3 * auVar35._4_4_ + fVar4 * auVar17._4_4_) * fVar32;
  auVar36._8_4_ = (fVar2 * auVar23._8_4_ + fVar3 * auVar35._8_4_ + fVar4 * auVar17._8_4_) * fVar33;
  auVar36._12_4_ =
       (fVar2 * auVar23._12_4_ + fVar3 * auVar35._12_4_ + fVar4 * auVar17._12_4_) * fVar34;
  auVar44._0_4_ = fVar2 * auVar36._0_4_;
  auVar44._4_4_ = fVar2 * auVar36._4_4_;
  auVar44._8_4_ = fVar2 * auVar36._8_4_;
  auVar44._12_4_ = fVar2 * auVar36._12_4_;
  auVar46._0_4_ = fVar3 * auVar36._0_4_;
  auVar46._4_4_ = fVar3 * auVar36._4_4_;
  auVar46._8_4_ = fVar3 * auVar36._8_4_;
  auVar46._12_4_ = fVar3 * auVar36._12_4_;
  auVar48._0_4_ = fVar4 * auVar36._0_4_;
  auVar48._4_4_ = fVar4 * auVar36._4_4_;
  auVar48._8_4_ = fVar4 * auVar36._8_4_;
  auVar48._12_4_ = fVar4 * auVar36._12_4_;
  auVar43 = vsubps_avx(auVar23,auVar44);
  auVar45 = ZEXT1664(auVar43);
  auVar23 = vsubps_avx(auVar35,auVar46);
  auVar47 = ZEXT1664(auVar23);
  auVar35 = vsubps_avx(auVar17,auVar48);
  auVar49 = ZEXT1664(auVar35);
  auVar30._0_4_ =
       auVar43._0_4_ * auVar43._0_4_ + auVar23._0_4_ * auVar23._0_4_ + auVar35._0_4_ * auVar35._0_4_
  ;
  auVar30._4_4_ =
       auVar43._4_4_ * auVar43._4_4_ + auVar23._4_4_ * auVar23._4_4_ + auVar35._4_4_ * auVar35._4_4_
  ;
  auVar30._8_4_ =
       auVar43._8_4_ * auVar43._8_4_ + auVar23._8_4_ * auVar23._8_4_ + auVar35._8_4_ * auVar35._8_4_
  ;
  auVar30._12_4_ =
       auVar43._12_4_ * auVar43._12_4_ +
       auVar23._12_4_ * auVar23._12_4_ + auVar35._12_4_ * auVar35._12_4_;
  auVar19._0_4_ = auVar27._0_4_ * auVar27._0_4_;
  auVar19._4_4_ = auVar27._4_4_ * auVar27._4_4_;
  auVar19._8_4_ = auVar27._8_4_ * auVar27._8_4_;
  auVar19._12_4_ = auVar27._12_4_ * auVar27._12_4_;
  auVar25 = vcmpps_avx(auVar30,auVar19,2);
  auVar17 = auVar20 & auVar25;
  if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0') {
    auVar25 = vandps_avx(auVar25,auVar20);
    auVar20 = vsubps_avx(auVar19,auVar30);
    auVar17._0_4_ = fVar24 * auVar20._0_4_;
    auVar17._4_4_ = fVar32 * auVar20._4_4_;
    auVar17._8_4_ = fVar33 * auVar20._8_4_;
    auVar17._12_4_ = fVar34 * auVar20._12_4_;
    auVar19 = vsqrtps_avx(auVar17);
    auVar55 = ZEXT1664(auVar19);
    auVar26 = vsubps_avx(auVar36,auVar19);
    auVar53._0_4_ = auVar19._0_4_ + auVar36._0_4_;
    auVar53._4_4_ = auVar19._4_4_ + auVar36._4_4_;
    auVar53._8_4_ = auVar19._8_4_ + auVar36._8_4_;
    auVar53._12_4_ = auVar19._12_4_ + auVar36._12_4_;
    auVar54 = ZEXT1664(auVar53);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar27._4_4_ = uVar1;
    auVar27._0_4_ = uVar1;
    auVar27._8_4_ = uVar1;
    auVar27._12_4_ = uVar1;
    auVar20 = vcmpps_avx(auVar27,auVar26,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar41._4_4_ = uVar1;
    auVar41._0_4_ = uVar1;
    auVar41._8_4_ = uVar1;
    auVar41._12_4_ = uVar1;
    auVar42 = ZEXT1664(auVar41);
    auVar17 = vcmpps_avx(auVar26,auVar41,2);
    auVar20 = vandps_avx(auVar17,auVar20);
    auVar56 = ZEXT1664(auVar20);
    auVar20 = vandps_avx(auVar20,auVar25);
    auVar17 = vcmpps_avx(auVar27,auVar53,2);
    auVar27 = vcmpps_avx(auVar53,auVar41,2);
    auVar17 = vandps_avx(auVar17,auVar27);
    auVar25 = vandps_avx(auVar17,auVar25);
    auVar38 = ZEXT1664(auVar25);
    auVar25 = vorps_avx(auVar20,auVar25);
    uVar11 = vmovmskps_avx(auVar25);
    if (uVar11 != 0) {
      auVar28._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = -auVar19._8_4_;
      auVar28._12_4_ = -auVar19._12_4_;
      local_1c8 = vblendvps_avx(auVar53,auVar26,auVar20);
      auVar25 = vblendvps_avx(auVar19,auVar28,auVar20);
      fVar24 = auVar25._0_4_;
      auVar29._0_4_ = fVar2 * fVar24;
      fVar32 = auVar25._4_4_;
      auVar29._4_4_ = fVar2 * fVar32;
      fVar33 = auVar25._8_4_;
      auVar29._8_4_ = fVar2 * fVar33;
      fVar34 = auVar25._12_4_;
      auVar29._12_4_ = fVar2 * fVar34;
      auVar37._0_4_ = fVar3 * fVar24;
      auVar37._4_4_ = fVar3 * fVar32;
      auVar37._8_4_ = fVar3 * fVar33;
      auVar37._12_4_ = fVar3 * fVar34;
      auVar20._0_4_ = fVar4 * fVar24;
      auVar20._4_4_ = fVar4 * fVar32;
      auVar20._8_4_ = fVar4 * fVar33;
      auVar20._12_4_ = fVar4 * fVar34;
      local_1b8 = vsubps_avx(auVar29,auVar43);
      local_1a8 = vsubps_avx(auVar37,auVar23);
      local_198 = vsubps_avx(auVar20,auVar35);
      uVar16 = (ulong)(uVar11 & 0xff);
      pauVar13 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar40 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        auVar25 = auVar38._0_16_;
        auVar23 = auVar49._0_16_;
        auVar20 = auVar45._0_16_;
        local_1f8.hit = (RTCHitN *)local_c8;
        local_1f8.valid = (int *)local_238;
        auVar43 = auVar47._0_16_;
        auVar27 = auVar52._0_16_;
        auVar17 = auVar51._0_16_;
        auVar26 = auVar55._0_16_;
        auVar35 = auVar50._0_16_;
        auVar36 = auVar56._0_16_;
        auVar19 = auVar54._0_16_;
        uVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar11 = *(uint *)(local_d8 + uVar9 * 4);
        pGVar5 = (pSVar15->geometries).items[uVar11].ptr;
        local_1f8.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar14 = true, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00dcb996;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c8 + uVar9 * 4);
          local_1f8.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar11),0);
          local_78 = (sphere->primIDs).field_0.i[uVar9];
          local_c8._4_4_ = *(undefined4 *)(local_1b8 + uVar9 * 4);
          uVar1 = *(undefined4 *)(local_1a8 + uVar9 * 4);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          local_a8._4_4_ = *(undefined4 *)(local_198 + uVar9 * 4);
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          auVar30 = SUB6416(ZEXT464(0),0) << 0x20;
          local_a8._0_4_ = local_a8._4_4_;
          local_a8._8_4_ = local_a8._4_4_;
          local_a8._12_4_ = local_a8._4_4_;
          local_98 = ZEXT432(0) << 0x20;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_1f8.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_238 = *pauVar13;
          local_1f8.geometryUserPtr = pGVar5->userPtr;
          local_1f8.N = 4;
          local_208 = auVar42._0_16_;
          local_f8._0_8_ = pSVar15;
          local_108 = auVar35;
          local_118 = auVar17;
          local_128 = auVar27;
          local_138 = auVar20;
          local_148 = auVar43;
          local_158 = auVar23;
          local_168 = auVar19;
          local_178 = auVar26;
          local_188 = auVar36;
          local_218 = auVar25;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar30 = SUB6416(ZEXT464(0),0) << 0x20;
            local_220 = pauVar13;
            (*pGVar5->occlusionFilterN)(&local_1f8);
            auVar56 = ZEXT1664(local_188);
            auVar55 = ZEXT1664(local_178);
            auVar54 = ZEXT1664(local_168);
            auVar49 = ZEXT1664(local_158);
            auVar47 = ZEXT1664(local_148);
            auVar45 = ZEXT1664(local_138);
            auVar52 = ZEXT1664(local_128);
            auVar51 = ZEXT1664(local_118);
            auVar50 = ZEXT1664(local_108);
            auVar40 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar42 = ZEXT1664(local_208);
            pauVar13 = local_220;
            pSVar15 = (Scene *)local_f8._0_8_;
          }
          if (local_238 == (undefined1  [16])0x0) {
            auVar20 = ZEXT816(0);
            auVar25 = vpcmpeqd_avx((undefined1  [16])0x0,auVar20);
            auVar20 = vpcmpeqd_avx(auVar20,auVar20);
            auVar25 = auVar25 ^ auVar20;
          }
          else {
            p_Var8 = context->args->filter;
            auVar20 = ZEXT816(0);
            auVar25 = vpcmpeqd_avx(auVar30,auVar30);
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&local_1f8);
              auVar25 = vpcmpeqd_avx(auVar25,auVar25);
              auVar20 = ZEXT816(0) << 0x40;
              auVar56 = ZEXT1664(local_188);
              auVar55 = ZEXT1664(local_178);
              auVar54 = ZEXT1664(local_168);
              auVar49 = ZEXT1664(local_158);
              auVar47 = ZEXT1664(local_148);
              auVar45 = ZEXT1664(local_138);
              auVar52 = ZEXT1664(local_128);
              auVar51 = ZEXT1664(local_118);
              auVar50 = ZEXT1664(local_108);
              auVar40 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar42 = ZEXT1664(local_208);
              pSVar15 = (Scene *)local_f8._0_8_;
            }
            auVar20 = vpcmpeqd_avx(local_238,auVar20);
            auVar25 = auVar20 ^ auVar25;
            auVar20 = vblendvps_avx(auVar40._0_16_,*(undefined1 (*) [16])(local_1f8.ray + 0x80),
                                    auVar20);
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) = auVar20;
          }
          auVar23 = auVar49._0_16_;
          auVar20 = auVar45._0_16_;
          auVar43 = auVar47._0_16_;
          auVar27 = auVar52._0_16_;
          auVar17 = auVar51._0_16_;
          auVar26 = auVar55._0_16_;
          auVar35 = auVar50._0_16_;
          auVar36 = auVar56._0_16_;
          auVar19 = auVar54._0_16_;
          auVar38 = ZEXT1664(local_218);
          auVar21._8_8_ = 0x100000001;
          auVar21._0_8_ = 0x100000001;
          if ((auVar21 & auVar25) != (undefined1  [16])0x0) {
            auVar42 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            bVar14 = true;
            auVar25 = local_218;
            goto LAB_00dcb996;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar42._0_4_;
        }
        auVar23 = auVar49._0_16_;
        auVar20 = auVar45._0_16_;
        auVar43 = auVar47._0_16_;
        auVar27 = auVar52._0_16_;
        auVar17 = auVar51._0_16_;
        auVar26 = auVar55._0_16_;
        auVar35 = auVar50._0_16_;
        auVar36 = auVar56._0_16_;
        auVar19 = auVar54._0_16_;
        uVar16 = uVar16 ^ 1L << (uVar9 & 0x3f);
      } while (uVar16 != 0);
      bVar14 = false;
      auVar25 = auVar38._0_16_;
LAB_00dcb996:
      local_220 = pauVar13;
      auVar30 = vshufps_avx(auVar42._0_16_,auVar42._0_16_,0);
      auVar30 = vcmpps_avx(auVar19,auVar30,2);
      auVar36 = vandps_avx(auVar36,auVar30);
      auVar25 = vandps_avx(auVar36,auVar25);
      uVar11 = vmovmskps_avx(auVar25);
      if (uVar11 == 0) {
        return bVar14;
      }
      fVar2 = auVar26._0_4_;
      auVar18._0_4_ = auVar35._0_4_ * fVar2;
      fVar3 = auVar26._4_4_;
      auVar18._4_4_ = auVar35._4_4_ * fVar3;
      fVar4 = auVar26._8_4_;
      auVar18._8_4_ = auVar35._8_4_ * fVar4;
      fVar24 = auVar26._12_4_;
      auVar18._12_4_ = auVar35._12_4_ * fVar24;
      auVar22._0_4_ = auVar17._0_4_ * fVar2;
      auVar22._4_4_ = auVar17._4_4_ * fVar3;
      auVar22._8_4_ = auVar17._8_4_ * fVar4;
      auVar22._12_4_ = auVar17._12_4_ * fVar24;
      auVar31._0_4_ = auVar27._0_4_ * fVar2;
      auVar31._4_4_ = auVar27._4_4_ * fVar3;
      auVar31._8_4_ = auVar27._8_4_ * fVar4;
      auVar31._12_4_ = auVar27._12_4_ * fVar24;
      local_1b8 = vsubps_avx(auVar18,auVar20);
      local_1a8 = vsubps_avx(auVar22,auVar43);
      local_198 = vsubps_avx(auVar31,auVar23);
      local_1c8 = auVar19;
      pSVar15 = context->scene;
      uVar16 = (ulong)(uVar11 & 0xff);
      auVar25 = ZEXT816(0) << 0x40;
      auVar45 = ZEXT1664(auVar25);
      auVar10 = vcmpps_avx(ZEXT1632(auVar25),ZEXT1632(auVar25),0xf);
      auVar47 = ZEXT3264(auVar10);
      auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar25 = vpcmpeqd_avx(auVar35,auVar35);
      auVar50 = ZEXT1664(auVar25);
      do {
        local_1f8.hit = (RTCHitN *)local_c8;
        local_1f8.valid = (int *)local_238;
        uVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar11 = *(uint *)(local_d8 + uVar9 * 4);
        pGVar5 = (pSVar15->geometries).items[uVar11].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar12 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00dcbc78;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c8 + uVar9 * 4);
          local_1f8.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar11),0);
          local_78 = (sphere->primIDs).field_0.i[uVar9];
          uVar1 = *(undefined4 *)(local_1b8 + uVar9 * 4);
          local_c8._4_4_ = uVar1;
          local_c8._0_4_ = uVar1;
          local_c8._8_4_ = uVar1;
          local_c8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_1a8 + uVar9 * 4);
          local_b8._4_4_ = uVar1;
          local_b8._0_4_ = uVar1;
          local_b8._8_4_ = uVar1;
          local_b8._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_198 + uVar9 * 4);
          local_a8._4_4_ = uVar1;
          local_a8._0_4_ = uVar1;
          local_a8._8_4_ = uVar1;
          local_a8._12_4_ = uVar1;
          local_98 = auVar45._0_32_;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_54 = (local_1f8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_1f8.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_238 = *local_220;
          local_1f8.geometryUserPtr = pGVar5->userPtr;
          local_1f8.N = 4;
          local_208 = auVar42._0_16_;
          local_218._0_8_ = pSVar15;
          local_f8 = auVar47._0_32_;
          local_1f8.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar25 = auVar50._0_16_;
            (*pGVar5->occlusionFilterN)(&local_1f8);
            auVar25 = vpcmpeqd_avx(auVar25,auVar25);
            auVar50 = ZEXT1664(auVar25);
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar47 = ZEXT3264(local_f8);
            auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar40 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar42 = ZEXT1664(local_208);
            pSVar15 = (Scene *)local_218._0_8_;
          }
          auVar25 = auVar50._0_16_;
          if (local_238 == (undefined1  [16])0x0) {
            auVar20 = vpcmpeqd_avx(auVar49._0_16_,(undefined1  [16])0x0);
            auVar25 = auVar25 ^ auVar20;
          }
          else {
            p_Var8 = context->args->filter;
            if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var8)(&local_1f8);
              auVar25 = vpcmpeqd_avx(auVar25,auVar25);
              auVar50 = ZEXT1664(auVar25);
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar47 = ZEXT3264(local_f8);
              auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar40 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar42 = ZEXT1664(local_208);
              pSVar15 = (Scene *)local_218._0_8_;
            }
            auVar20 = vpcmpeqd_avx(auVar49._0_16_,local_238);
            auVar25 = auVar50._0_16_ ^ auVar20;
            auVar20 = vblendvps_avx(auVar40._0_16_,*(undefined1 (*) [16])(local_1f8.ray + 0x80),
                                    auVar20);
            *(undefined1 (*) [16])(local_1f8.ray + 0x80) = auVar20;
          }
          auVar23._8_8_ = 0x100000001;
          auVar23._0_8_ = 0x100000001;
          if ((auVar23 & auVar25) != (undefined1  [16])0x0) {
            bVar12 = 1;
            goto LAB_00dcbc78;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar42._0_4_;
        }
        uVar16 = uVar16 ^ 1L << (uVar9 & 0x3f);
        if (uVar16 == 0) {
          bVar12 = 0;
LAB_00dcbc78:
          return (bool)(bVar14 | bVar12);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }